

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

TapBranchDataStruct * __thiscall
cfd::js::api::json::TapBranchData::ConvertToStruct
          (TapBranchDataStruct *__return_storage_ptr__,TapBranchData *this)

{
  _Rb_tree_header *p_Var1;
  
  (__return_storage_ptr__->tapscript)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->tapscript).field_2;
  (__return_storage_ptr__->tapscript)._M_string_length = 0;
  (__return_storage_ptr__->tapscript).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->branch_hash)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->branch_hash).field_2;
  (__return_storage_ptr__->branch_hash)._M_string_length = 0;
  (__return_storage_ptr__->branch_hash).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->tree_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->tree_string).field_2;
  (__return_storage_ptr__->tree_string)._M_string_length = 0;
  (__return_storage_ptr__->tree_string).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->branch_hash);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->tree_string);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

TapBranchDataStruct TapBranchData::ConvertToStruct() const {  // NOLINT
  TapBranchDataStruct result;
  result.tapscript = tapscript_;
  result.branch_hash = branch_hash_;
  result.tree_string = tree_string_;
  result.ignore_items = ignore_items;
  return result;
}